

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::switch_to_big
          (small_vector<pstore::command_line::literal,_3UL> *this,size_t new_elements)

{
  vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_> *__result;
  pointer plVar1;
  
  __result = &this->big_buffer_;
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::clear
            (__result);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  reserve(__result,new_elements);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<pstore::command_line::literal*,std::back_insert_iterator<std::vector<pstore::command_line::literal,std::allocator<pstore::command_line::literal>>>>
            (this->buffer_,this->buffer_ + this->elements_,
             (back_insert_iterator<std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
              )__result);
  if (new_elements < 4) {
    plVar1 = (this->small_buffer_)._M_elems;
  }
  else {
    plVar1 = (this->big_buffer_).
             super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->buffer_ = plVar1;
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }